

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ordering.hpp
# Opt level: O2

Result __thiscall
Kernel::LAKBO::cmpSameSkeleton<Kernel::NumTraits<Kernel::RealConstantType>>
          (LAKBO *this,Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *t0,
          Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *t1)

{
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *t0_00;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *t1_00;
  Result RVar1;
  anon_class_1_0_00000001 set;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> local_98;
  Stack<std::tuple<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::IntegerConstantType>_>
  local_78;
  Stack<std::tuple<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::IntegerConstantType>_>
  local_58;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> local_38;
  
  t0_00 = (t0->_summands)._stack;
  if (((int)(((long)(t0->_summands)._cursor - (long)t0_00) / 0x30) == 1) &&
     (t1_00 = (t1->_summands)._stack,
     (int)(((long)(t1->_summands)._cursor - (long)t1_00) / 0x30) == 1)) {
    RVar1 = cmpSameSkeleton<Kernel::NumTraits<Kernel::RealConstantType>>(this,t0_00,t1_00);
    return RVar1;
  }
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::Stack
            (&local_38,&t0->_summands);
  const::{lambda(auto:1)#1}::operator()
            ((MultiSet<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)&local_58,
             (_lambda_auto_1__1_ *)&set,
             (Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)&local_38);
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::Stack
            (&local_98,&t1->_summands);
  const::{lambda(auto:1)#1}::operator()
            ((MultiSet<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)&local_78,
             (_lambda_auto_1__1_ *)&set,
             (Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)&local_98);
  RVar1 = OrderingUtils::
          mulExt<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::LAKBO::cmpSameSkeleton<Kernel::NumTraits<Kernel::RealConstantType>>(Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>const&,Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>const&)const::_lambda(auto:1&,auto:2&)_1_>
                    ((MultiSet<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                     &local_58,
                     (MultiSet<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                     &local_78,(anon_class_8_1_8991fb9c)this);
  Lib::
  Stack<std::tuple<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::IntegerConstantType>_>
  ::~Stack(&local_78);
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::~Stack(&local_98);
  Lib::
  Stack<std::tuple<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::IntegerConstantType>_>
  ::~Stack(&local_58);
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::~Stack(&local_38);
  return RVar1;
}

Assistant:

Ordering::Result cmpSameSkeleton(Polynom<NumTraits> const& t0, Polynom<NumTraits> const& t1) const 
  { 
    if (t0.nSummands() == 1 && t1.nSummands() == 1) {
      return cmpSameSkeleton(t0.summandAt(0), t1.summandAt(0));
    } else {
      auto set = [](auto p) { return p.iterSummands().map([](auto& x) { return x; }).template collect<MultiSet>(); };
      return OrderingUtils::mulExt(set(t0), set(t1), [&](auto& l, auto& r) { return compare(l, r); });
    }
  }